

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

bool __thiscall
soul::ResolutionPass::GenericFunctionResolver::findGenericFunctionTypes
          (GenericFunctionResolver *this,CallOrCast *call,Function *function,
          ArrayView<soul::Type> callerArgumentTypes,TypeArray *resolvedTypes,bool shouldIgnoreErrors
          )

{
  pointer ppVar1;
  bool bVar2;
  Expression *paramType_00;
  Type *callerArgumentType;
  Identifier *name;
  Function *extraout_RDX;
  Function *name_00;
  Function *extraout_RDX_00;
  ulong i;
  bool anyReferencesInvolved;
  Type resolvedType;
  Type newMatch;
  pool_ptr<soul::AST::Expression> paramType;
  bool local_111;
  Identifier local_110;
  Type local_108;
  CallOrCast *local_e8;
  UnqualifiedName *local_e0;
  pointer local_d8;
  pointer local_d0;
  undefined1 local_c8 [32];
  TypeArray *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Type local_80;
  pool_ptr<soul::AST::Expression> local_68;
  string local_60;
  ArrayView<soul::Type> local_40;
  
  local_40.e = callerArgumentTypes.e;
  local_40.s = callerArgumentTypes.s;
  local_d0 = (function->genericWildcards).
             super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (function->genericWildcards).
             super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  name_00 = function;
  local_e8 = call;
  local_a8 = resolvedTypes;
  do {
    if (local_d0 == local_d8) {
LAB_002511f5:
      return local_d0 == local_d8;
    }
    local_e0 = local_d0->object;
    local_110.name = (local_e0->identifier).name;
    local_108.category = invalid;
    local_108.arrayElementCategory = invalid;
    local_108.isRef = false;
    local_108.isConstant = false;
    local_108.primitiveType.type = invalid;
    local_108.boundingSize = 0;
    local_108.arrayElementBoundingSize = 0;
    local_108.structure.object = (Structure *)0x0;
    for (i = 0; ppVar1 = (function->parameters).
                         super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
        i < (ulong)((long)(function->parameters).
                          super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3); i = i + 1
        ) {
      local_68.object = ((ppVar1[i].object)->declaredType).object;
      if (local_68.object != (Expression *)0x0) {
        local_111 = false;
        paramType_00 = pool_ptr<soul::AST::Expression>::operator*(&local_68);
        callerArgumentType = ArrayView<soul::Type>::operator[](&local_40,i);
        matchParameterAgainstWildcard
                  (&local_80,this,paramType_00,callerArgumentType,&local_110,&local_111);
        if (local_80.category != invalid) {
          if (local_80.isRef == false) {
            Type::removeConstIfPresent((Type *)local_c8,&local_80);
            Type::operator=(&local_80,(Type *)local_c8);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)(local_c8 + 0x10));
          }
          if (local_108.category == invalid) {
            Type::operator=(&local_108,&local_80);
          }
          else {
            bVar2 = Type::isIdentical(&local_80,&local_108);
            if (!bVar2) {
              if (!shouldIgnoreErrors) {
                quoteName_abi_cxx11_(&local_60,(soul *)&local_110,name);
                std::operator+(&local_a0,"Could not find a value for ",&local_60);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c8,&local_a0," that satisfies all argument types");
                throwResolutionError
                          (this,local_e8,function,
                           &(local_e0->super_Expression).super_Statement.super_ASTObject.context,
                           (string *)local_c8);
                std::__cxx11::string::~string((string *)local_c8);
                std::__cxx11::string::~string((string *)&local_a0);
                std::__cxx11::string::~string((string *)&local_60);
              }
              RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
              goto LAB_002511e6;
            }
          }
        }
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
        name_00 = extraout_RDX;
      }
    }
    if (local_108.category == invalid) {
      if (!shouldIgnoreErrors) {
        quoteName_abi_cxx11_(&local_a0,(soul *)&local_110,(Identifier *)name_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"Failed to resolve generic parameter ",&local_a0);
        throwResolutionError
                  (this,local_e8,function,
                   &(local_e0->super_Expression).super_Statement.super_ASTObject.context,
                   (string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)&local_a0);
      }
LAB_002511e6:
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_108.structure);
      goto LAB_002511f5;
    }
    ArrayWithPreallocation<soul::Type,_8UL>::push_back(local_a8,&local_108);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_108.structure);
    local_d0 = local_d0 + 1;
    name_00 = extraout_RDX_00;
  } while( true );
}

Assistant:

bool findGenericFunctionTypes (AST::CallOrCast& call, AST::Function& function, ArrayView<Type> callerArgumentTypes, AST::TypeArray& resolvedTypes, bool shouldIgnoreErrors)
        {
            for (auto wildcardToResolve : function.genericWildcards)
            {
                auto wildcardName = wildcardToResolve->identifier;
                Type resolvedType;

                for (size_t i = 0; i < function.parameters.size(); ++i)
                {
                    if (auto paramType = function.parameters[i]->declaredType)
                    {
                        bool anyReferencesInvolved = false;
                        auto newMatch = matchParameterAgainstWildcard (*paramType, callerArgumentTypes[i], wildcardName, anyReferencesInvolved);

                        if (newMatch.isValid())
                        {
                            if (! newMatch.isReference())
                                newMatch = newMatch.removeConstIfPresent();

                            if (resolvedType.isValid())
                            {
                                if (! newMatch.isIdentical (resolvedType))
                                {
                                    if (! shouldIgnoreErrors)
                                        throwResolutionError (call, function, wildcardToResolve->context,
                                                              "Could not find a value for " + quoteName (wildcardName) + " that satisfies all argument types");

                                    return false;
                                }
                            }
                            else
                            {
                                resolvedType = newMatch;
                            }
                        }
                    }
                }

                if (! resolvedType.isValid())
                {
                    if (! shouldIgnoreErrors)
                        throwResolutionError (call, function, wildcardToResolve->context,
                                              "Failed to resolve generic parameter " + quoteName (wildcardName));
                    return false;
                }

                resolvedTypes.push_back (resolvedType);
            }

            return true;
        }